

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

AnimationCurveMap * __thiscall
Assimp::FBX::AnimationCurveNode::Curves_abi_cxx11_(AnimationCurveNode *this)

{
  Document *this_00;
  bool bVar1;
  uint64_t dest;
  reference ppCVar2;
  long lVar3;
  string *__k;
  mapped_type *ppAVar4;
  mapped_type local_f8;
  allocator local_b9;
  string local_b8;
  mapped_type local_98;
  AnimationCurve *anim;
  string local_88;
  Object *local_68;
  Object *ob;
  Connection *local_50;
  Connection *con;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range3;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_18;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  AnimationCurveNode *this_local;
  
  conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)this;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
          ::empty(&this->curves);
  if (bVar1) {
    this_00 = this->doc;
    dest = Object::ID(&this->super_Object);
    Document::GetConnectionsByDestinationSequenced
              ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                *)&__range3,this_00,dest,"AnimationCurve");
    local_18 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                *)&__range3;
    __end3 = std::
             vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      *)&__range3);
    con = (Connection *)
          std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                       *)&con), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                ::operator*(&__end3);
      local_50 = *ppCVar2;
      Connection::PropertyName_abi_cxx11_(local_50);
      lVar3 = std::__cxx11::string::length();
      if (lVar3 != 0) {
        local_68 = Connection::SourceObject(local_50);
        if (local_68 == (Object *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_88,
                     "failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring"
                     ,(allocator *)((long)&anim + 7));
          Util::DOMWarning(&local_88,(this->super_Object).element);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator((allocator<char> *)((long)&anim + 7));
        }
        else {
          if (local_68 == (Object *)0x0) {
            local_f8 = (mapped_type)0x0;
          }
          else {
            local_f8 = (mapped_type)
                       __dynamic_cast(local_68,&Object::typeinfo,&AnimationCurve::typeinfo,0);
          }
          local_98 = local_f8;
          if (local_f8 == (mapped_type)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_b8,
                       "source object for ->AnimationCurveNode link is not an AnimationCurve",
                       &local_b9);
            Util::DOMWarning(&local_b8,(this->super_Object).element);
            std::__cxx11::string::~string((string *)&local_b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          }
          else {
            __k = Connection::PropertyName_abi_cxx11_(local_50);
            ppAVar4 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                      ::operator[](&this->curves,__k);
            *ppAVar4 = local_f8;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
    ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)&__range3);
  }
  return &this->curves;
}

Assistant:

const AnimationCurveMap& AnimationCurveNode::Curves() const
{
    if ( curves.empty() ) {
        // resolve attached animation curves
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurve");

        for(const Connection* con : conns) {

            // link should go for a property
            if (!con->PropertyName().length()) {
                continue;
            }

            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring",&element);
                continue;
            }

            const AnimationCurve* const anim = dynamic_cast<const AnimationCurve*>(ob);
            if(!anim) {
                DOMWarning("source object for ->AnimationCurveNode link is not an AnimationCurve",&element);
                continue;
            }

            curves[con->PropertyName()] = anim;
        }
    }

    return curves;
}